

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int aux_type2size(uint8_t type)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,type);
  switch(iVar1) {
  case 0x41:
  case 0x43:
switchD_001317cb_caseD_63:
    return 1;
  case 0x42:
  case 0x48:
switchD_001317df_caseD_42:
    return (uint)type;
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
switchD_001317cb_caseD_65:
    return 0;
  case 0x49:
switchD_001317cb_caseD_66:
    iVar1 = 4;
    break;
  default:
    switch(iVar1) {
    case 99:
      goto switchD_001317cb_caseD_63;
    case 100:
      iVar1 = 8;
      break;
    case 0x65:
    case 0x67:
    case 0x68:
      goto switchD_001317cb_caseD_65;
    case 0x66:
    case 0x69:
      goto switchD_001317cb_caseD_66;
    default:
      if (iVar1 != 0x73) {
        if (iVar1 == 0x5a) goto switchD_001317df_caseD_42;
        if (iVar1 != 0x53) {
          return 0;
        }
      }
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

static inline int aux_type2size(uint8_t type)
{
    switch (type) {
    case 'A': case 'c': case 'C':
        return 1;
    case 's': case 'S':
        return 2;
    case 'i': case 'I': case 'f':
        return 4;
    case 'd':
        return 8;
    case 'Z': case 'H': case 'B':
        return type;
    default:
        return 0;
    }
}